

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tmpdir.c
# Opt level: O1

int run_test_tmpdir(void)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  long *plVar6;
  int *piVar7;
  undefined8 uVar8;
  char *unaff_RBX;
  ulong *puVar9;
  int64_t eval_b;
  int64_t eval_a;
  size_t len;
  char tmpdir [4096];
  ulong uStack_1ea0;
  ulong uStack_1e98;
  int iStack_1e90;
  int iStack_1e8c;
  undefined1 auStack_1e88 [8];
  long alStack_1e80 [7];
  byte bStack_1e46;
  undefined8 auStack_1d68 [7];
  uint uStack_1d30;
  undefined1 auStack_1c50 [808];
  long *plStack_1928;
  code *pcStack_1920;
  long lStack_1918;
  long lStack_1910;
  long alStack_1908 [35];
  long alStack_17f0 [35];
  long alStack_16d8 [35];
  long alStack_15c0 [101];
  code *pcStack_1298;
  long lStack_1288;
  long lStack_1280;
  uint uStack_1278;
  uint uStack_1274;
  ulong auStack_1270 [35];
  ulong auStack_1158 [35];
  char *pcStack_1040;
  undefined8 local_1010;
  char local_1008 [4096];
  
  local_1010 = 0x1000;
  local_1008[0] = '\0';
  sVar5 = strlen(local_1008);
  if (sVar5 == 0) {
    iVar1 = uv_os_tmpdir(local_1008,&local_1010);
    if (iVar1 != 0) goto LAB_001d7ed8;
    unaff_RBX = local_1008;
    sVar5 = strlen(unaff_RBX);
    if (sVar5 != local_1010) goto LAB_001d7ee7;
    if ((long)local_1010 < 1) goto LAB_001d7ef6;
    if (local_1008[local_1010] != '\0') goto LAB_001d7f05;
    if ((local_1010 < 2) || (unaff_RBX[local_1010 - 1] != '/')) {
      local_1010 = 1;
      iVar1 = uv_os_tmpdir(local_1008);
      if (iVar1 != -0x69) goto LAB_001d7f14;
      if ((long)local_1010 < 2) goto LAB_001d7f23;
      iVar1 = uv_os_tmpdir(0,&local_1010);
      if (iVar1 != -0x16) goto LAB_001d7f32;
      iVar1 = uv_os_tmpdir(local_1008,0);
      if (iVar1 != -0x16) goto LAB_001d7f41;
      local_1010 = 0;
      iVar1 = uv_os_tmpdir(local_1008);
      if (iVar1 == -0x16) {
        return 0;
      }
      goto LAB_001d7f50;
    }
  }
  else {
    run_test_tmpdir_cold_1();
LAB_001d7ed8:
    run_test_tmpdir_cold_2();
LAB_001d7ee7:
    run_test_tmpdir_cold_3();
LAB_001d7ef6:
    run_test_tmpdir_cold_4();
LAB_001d7f05:
    run_test_tmpdir_cold_5();
LAB_001d7f14:
    run_test_tmpdir_cold_6();
LAB_001d7f23:
    run_test_tmpdir_cold_7();
LAB_001d7f32:
    run_test_tmpdir_cold_8();
LAB_001d7f41:
    run_test_tmpdir_cold_9();
LAB_001d7f50:
    run_test_tmpdir_cold_10();
  }
  run_test_tmpdir_cold_11();
  pcStack_1298 = (code *)0x1d7f80;
  pcStack_1040 = unaff_RBX;
  plVar6 = (long *)uv_default_loop();
  pcStack_1298 = (code *)0x1d7f95;
  uVar2 = open64("/dev/tty",0,0);
  if ((int)uVar2 < 0) {
    pcStack_1298 = (code *)0x1d83c8;
    run_test_tty_cold_24();
    return 7;
  }
  piVar7 = (int *)(ulong)uVar2;
  pcStack_1298 = (code *)0x1d7fb5;
  iVar1 = open64("/dev/tty",1,0);
  if (iVar1 < 0) {
    pcStack_1298 = (code *)0x1d83d2;
    run_test_tty_cold_23();
    return 7;
  }
  auStack_1270[0] = 0;
  auStack_1158[0] = 0;
  pcStack_1298 = (code *)0x1d8022;
  uVar3 = uv_guess_handle(0xffffffff);
  auStack_1270[0] = (ulong)uVar3;
  if (auStack_1158[0] == auStack_1270[0]) {
    auStack_1158[0] = 0xe;
    pcStack_1298 = (code *)0x1d8050;
    uVar2 = uv_guess_handle(uVar2);
    auStack_1270[0] = (ulong)uVar2;
    if (auStack_1158[0] != auStack_1270[0]) goto LAB_001d840d;
    auStack_1158[0] = 0xe;
    pcStack_1298 = (code *)0x1d807d;
    uVar2 = uv_guess_handle(iVar1);
    auStack_1270[0] = (ulong)uVar2;
    if (auStack_1158[0] != auStack_1270[0]) goto LAB_001d841f;
    pcStack_1298 = (code *)0x1d80af;
    iVar4 = uv_tty_init(plVar6,auStack_1158,piVar7,1);
    auStack_1270[0] = (ulong)iVar4;
    lStack_1288 = 0;
    if (auStack_1270[0] != 0) goto LAB_001d8431;
    pcStack_1298 = (code *)0x1d80dc;
    iVar4 = uv_is_readable(auStack_1158);
    if (iVar4 == 0) goto LAB_001d8440;
    pcStack_1298 = (code *)0x1d80f1;
    iVar4 = uv_is_writable(auStack_1158);
    if (iVar4 != 0) goto LAB_001d8445;
    pcStack_1298 = (code *)0x1d810a;
    iVar1 = uv_tty_init(plVar6,auStack_1270,iVar1,0);
    lStack_1288 = (long)iVar1;
    lStack_1280 = 0;
    if (lStack_1288 != 0) goto LAB_001d844a;
    pcStack_1298 = (code *)0x1d8134;
    iVar1 = uv_is_readable(auStack_1270);
    if (iVar1 != 0) goto LAB_001d8459;
    pcStack_1298 = (code *)0x1d8146;
    iVar1 = uv_is_writable(auStack_1270);
    if (iVar1 == 0) goto LAB_001d845e;
    pcStack_1298 = (code *)0x1d8162;
    iVar1 = uv_tty_get_winsize(auStack_1270,&uStack_1274,&uStack_1278);
    lStack_1288 = (long)iVar1;
    lStack_1280 = 0;
    if (lStack_1288 != 0) goto LAB_001d8463;
    pcStack_1298 = (code *)0x1d8198;
    printf("width=%d height=%d\n",(ulong)uStack_1274,(ulong)uStack_1278);
    if (uStack_1274 == 0 && uStack_1278 == 0) {
      pcStack_1298 = (code *)0x1d81b8;
      uv_walk(plVar6,close_walk_cb,0);
      pcStack_1298 = (code *)0x1d81c2;
      uv_run(plVar6,0);
      lStack_1288 = 0;
      pcStack_1298 = (code *)0x1d81d3;
      iVar1 = uv_loop_close(plVar6);
      lStack_1280 = (long)iVar1;
      if (lStack_1288 == lStack_1280) {
        pcStack_1298 = (code *)0x1d81ef;
        uv_library_shutdown();
        return 7;
      }
      goto LAB_001d8472;
    }
    lStack_1280 = 0;
    lStack_1288 = (long)(int)uStack_1274;
    if ((long)(int)uStack_1274 < 1) goto LAB_001d8481;
    lStack_1288 = (long)(int)uStack_1278;
    lStack_1280 = 0;
    if (lStack_1288 < 1) goto LAB_001d8490;
    pcStack_1298 = (code *)0x1d824a;
    iVar1 = uv_tty_set_mode(auStack_1158,1);
    lStack_1288 = (long)iVar1;
    lStack_1280 = 0;
    if (lStack_1288 != 0) goto LAB_001d849f;
    pcStack_1298 = (code *)0x1d8279;
    iVar1 = uv_tty_set_mode(auStack_1158,0);
    lStack_1288 = (long)iVar1;
    lStack_1280 = 0;
    if (lStack_1288 != 0) goto LAB_001d84ae;
    pcStack_1298 = (code *)0x1d829e;
    piVar7 = __errno_location();
    *piVar7 = 0;
    pcStack_1298 = (code *)0x1d82ac;
    iVar1 = uv_tty_reset_mode();
    lStack_1288 = (long)iVar1;
    lStack_1280 = 0;
    if (lStack_1288 != 0) goto LAB_001d84bd;
    pcStack_1298 = (code *)0x1d82d1;
    iVar1 = uv_tty_reset_mode();
    lStack_1288 = (long)iVar1;
    lStack_1280 = 0;
    if (lStack_1288 != 0) goto LAB_001d84cc;
    pcStack_1298 = (code *)0x1d82f6;
    iVar1 = uv_tty_reset_mode();
    lStack_1288 = (long)iVar1;
    lStack_1280 = 0;
    if (lStack_1288 != 0) goto LAB_001d84db;
    lStack_1288 = (long)*piVar7;
    lStack_1280 = 0;
    if (lStack_1288 != 0) goto LAB_001d84ea;
    piVar7 = (int *)0x0;
    pcStack_1298 = (code *)0x1d8349;
    uv_close(auStack_1158,0);
    pcStack_1298 = (code *)0x1d8355;
    uv_close(auStack_1270,0);
    pcStack_1298 = (code *)0x1d835f;
    uv_run(plVar6,0);
    pcStack_1298 = (code *)0x1d8364;
    plVar6 = (long *)uv_default_loop();
    pcStack_1298 = (code *)0x1d8378;
    uv_walk(plVar6,close_walk_cb,0);
    pcStack_1298 = (code *)0x1d8382;
    uv_run(plVar6,0);
    lStack_1288 = 0;
    pcStack_1298 = (code *)0x1d8390;
    uVar8 = uv_default_loop();
    pcStack_1298 = (code *)0x1d8398;
    iVar1 = uv_loop_close(uVar8);
    lStack_1280 = (long)iVar1;
    if (lStack_1288 == lStack_1280) {
      pcStack_1298 = (code *)0x1d83b4;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_1298 = (code *)0x1d840d;
    run_test_tty_cold_1();
LAB_001d840d:
    pcStack_1298 = (code *)0x1d841f;
    run_test_tty_cold_2();
LAB_001d841f:
    pcStack_1298 = (code *)0x1d8431;
    run_test_tty_cold_3();
LAB_001d8431:
    pcStack_1298 = (code *)0x1d8440;
    run_test_tty_cold_4();
LAB_001d8440:
    pcStack_1298 = (code *)0x1d8445;
    run_test_tty_cold_20();
LAB_001d8445:
    pcStack_1298 = (code *)0x1d844a;
    run_test_tty_cold_5();
LAB_001d844a:
    pcStack_1298 = (code *)0x1d8459;
    run_test_tty_cold_6();
LAB_001d8459:
    pcStack_1298 = (code *)0x1d845e;
    run_test_tty_cold_7();
LAB_001d845e:
    pcStack_1298 = (code *)0x1d8463;
    run_test_tty_cold_19();
LAB_001d8463:
    pcStack_1298 = (code *)0x1d8472;
    run_test_tty_cold_8();
LAB_001d8472:
    pcStack_1298 = (code *)0x1d8481;
    run_test_tty_cold_18();
LAB_001d8481:
    pcStack_1298 = (code *)0x1d8490;
    run_test_tty_cold_9();
LAB_001d8490:
    pcStack_1298 = (code *)0x1d849f;
    run_test_tty_cold_10();
LAB_001d849f:
    pcStack_1298 = (code *)0x1d84ae;
    run_test_tty_cold_11();
LAB_001d84ae:
    pcStack_1298 = (code *)0x1d84bd;
    run_test_tty_cold_12();
LAB_001d84bd:
    pcStack_1298 = (code *)0x1d84cc;
    run_test_tty_cold_13();
LAB_001d84cc:
    pcStack_1298 = (code *)0x1d84db;
    run_test_tty_cold_14();
LAB_001d84db:
    pcStack_1298 = (code *)0x1d84ea;
    run_test_tty_cold_15();
LAB_001d84ea:
    pcStack_1298 = (code *)0x1d84f9;
    run_test_tty_cold_16();
  }
  pcStack_1298 = run_test_tty_file;
  run_test_tty_cold_17();
  pcStack_1920 = (code *)0x1d851d;
  pcStack_1298 = (code *)plVar6;
  iVar1 = uv_loop_init(alStack_15c0);
  alStack_16d8[0] = (long)iVar1;
  alStack_17f0[0] = 0;
  if (alStack_16d8[0] == 0) {
    pcStack_1920 = (code *)0x1d8559;
    uVar2 = open64("test/fixtures/empty_file",0);
    if (uVar2 != 0xffffffff) {
      plVar6 = (long *)(ulong)uVar2;
      alStack_17f0[0] = -0x16;
      pcStack_1920 = (code *)0x1d858c;
      iVar1 = uv_tty_init(alStack_15c0,alStack_16d8,uVar2,1);
      alStack_1908[0] = (long)iVar1;
      if (alStack_17f0[0] != alStack_1908[0]) goto LAB_001d8a63;
      pcStack_1920 = (code *)0x1d85ad;
      iVar1 = close(uVar2);
      alStack_17f0[0] = (long)iVar1;
      alStack_1908[0] = 0;
      if (alStack_17f0[0] != 0) goto LAB_001d8a75;
      alStack_17f0[0] = -0x16;
      pcStack_1920 = (code *)0x1d85fb;
      iVar1 = uv_tty_init(alStack_15c0,alStack_16d8,uVar2,1);
      alStack_1908[0] = (long)iVar1;
      if (alStack_17f0[0] == alStack_1908[0]) goto LAB_001d8615;
      goto LAB_001d8a99;
    }
LAB_001d8615:
    pcStack_1920 = (code *)0x1d8625;
    uVar2 = open64("/dev/random",0);
    if (uVar2 != 0xffffffff) {
      plVar6 = (long *)(ulong)uVar2;
      alStack_17f0[0] = -0x16;
      pcStack_1920 = (code *)0x1d8654;
      iVar1 = uv_tty_init(alStack_15c0,alStack_16d8,uVar2,1);
      alStack_1908[0] = (long)iVar1;
      if (alStack_17f0[0] != alStack_1908[0]) goto LAB_001d8a87;
      pcStack_1920 = (code *)0x1d8675;
      iVar1 = close(uVar2);
      alStack_17f0[0] = (long)iVar1;
      alStack_1908[0] = 0;
      if (alStack_17f0[0] == 0) goto LAB_001d869b;
      goto LAB_001d8aab;
    }
LAB_001d869b:
    pcStack_1920 = (code *)0x1d86ab;
    uVar2 = open64("/dev/zero",0);
    if (uVar2 != 0xffffffff) {
      plVar6 = (long *)(ulong)uVar2;
      alStack_17f0[0] = -0x16;
      pcStack_1920 = (code *)0x1d86da;
      iVar1 = uv_tty_init(alStack_15c0,alStack_16d8,uVar2,1);
      alStack_1908[0] = (long)iVar1;
      if (alStack_17f0[0] != alStack_1908[0]) goto LAB_001d8abd;
      pcStack_1920 = (code *)0x1d86fb;
      iVar1 = close(uVar2);
      alStack_17f0[0] = (long)iVar1;
      alStack_1908[0] = 0;
      if (alStack_17f0[0] == 0) goto LAB_001d8721;
      goto LAB_001d8acf;
    }
LAB_001d8721:
    pcStack_1920 = (code *)0x1d8734;
    uVar2 = open64("/dev/tty",2);
    if (uVar2 != 0xffffffff) {
      plVar6 = (long *)(ulong)uVar2;
      pcStack_1920 = (code *)0x1d875b;
      iVar1 = uv_tty_init(alStack_15c0,alStack_16d8,uVar2,1);
      alStack_17f0[0] = (long)iVar1;
      alStack_1908[0] = 0;
      if (alStack_17f0[0] != 0) goto LAB_001d8ae1;
      pcStack_1920 = (code *)0x1d8788;
      iVar1 = close(uVar2);
      alStack_17f0[0] = (long)iVar1;
      alStack_1908[0] = 0;
      if (alStack_17f0[0] != 0) goto LAB_001d8af3;
      pcStack_1920 = (code *)0x1d87bb;
      iVar1 = uv_is_readable(alStack_16d8);
      if (iVar1 == 0) goto LAB_001d8b05;
      pcStack_1920 = (code *)0x1d87d0;
      iVar1 = uv_is_writable(alStack_16d8);
      if (iVar1 == 0) goto LAB_001d8b0a;
      plVar6 = alStack_16d8;
      pcStack_1920 = (code *)0x1d87ea;
      uv_close(plVar6);
      pcStack_1920 = (code *)0x1d87f2;
      iVar1 = uv_is_readable(plVar6);
      if (iVar1 != 0) goto LAB_001d8b1c;
      pcStack_1920 = (code *)0x1d8807;
      iVar1 = uv_is_writable(alStack_16d8);
      if (iVar1 == 0) goto LAB_001d880f;
      goto LAB_001d8b2e;
    }
LAB_001d880f:
    pcStack_1920 = (code *)0x1d881f;
    uVar2 = open64("/dev/tty",0);
    if (uVar2 != 0xffffffff) {
      plVar6 = (long *)(ulong)uVar2;
      pcStack_1920 = (code *)0x1d8846;
      iVar1 = uv_tty_init(alStack_15c0,alStack_17f0,uVar2,1);
      alStack_1908[0] = (long)iVar1;
      lStack_1918 = 0;
      if (alStack_1908[0] != 0) goto LAB_001d8b0f;
      pcStack_1920 = (code *)0x1d886b;
      iVar1 = close(uVar2);
      alStack_1908[0] = (long)iVar1;
      lStack_1918 = 0;
      if (alStack_1908[0] != 0) goto LAB_001d8b21;
      pcStack_1920 = (code *)0x1d8896;
      iVar1 = uv_is_readable(alStack_17f0);
      if (iVar1 == 0) goto LAB_001d8b33;
      pcStack_1920 = (code *)0x1d88ab;
      iVar1 = uv_is_writable(alStack_17f0);
      if (iVar1 != 0) goto LAB_001d8b38;
      plVar6 = alStack_17f0;
      pcStack_1920 = (code *)0x1d88c5;
      uv_close(plVar6,0);
      pcStack_1920 = (code *)0x1d88cd;
      iVar1 = uv_is_readable(plVar6);
      if (iVar1 != 0) goto LAB_001d8b4a;
      pcStack_1920 = (code *)0x1d88e2;
      iVar1 = uv_is_writable(alStack_17f0);
      if (iVar1 == 0) goto LAB_001d88ea;
      goto LAB_001d8b5c;
    }
LAB_001d88ea:
    pcStack_1920 = (code *)0x1d88fd;
    uVar2 = open64("/dev/tty",1);
    if (uVar2 == 0xffffffff) {
LAB_001d89b6:
      pcStack_1920 = (code *)0x1d89c5;
      iVar1 = uv_run(alStack_15c0,0);
      lStack_1918 = (long)iVar1;
      lStack_1910 = 0;
      if (lStack_1918 != 0) goto LAB_001d8a49;
      plVar6 = alStack_15c0;
      pcStack_1920 = (code *)0x1d89f8;
      uv_walk(plVar6,close_walk_cb,0);
      pcStack_1920 = (code *)0x1d8a02;
      uv_run(plVar6,0);
      lStack_1918 = 0;
      pcStack_1920 = (code *)0x1d8a12;
      iVar1 = uv_loop_close(plVar6);
      lStack_1910 = (long)iVar1;
      if (lStack_1918 == lStack_1910) {
        pcStack_1920 = (code *)0x1d8a29;
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001d8a56;
    }
    plVar6 = (long *)(ulong)uVar2;
    pcStack_1920 = (code *)0x1d891e;
    iVar1 = uv_tty_init(alStack_15c0,alStack_1908,uVar2,0);
    lStack_1918 = (long)iVar1;
    lStack_1910 = 0;
    if (lStack_1918 != 0) goto LAB_001d8b3d;
    pcStack_1920 = (code *)0x1d8943;
    iVar1 = close(uVar2);
    lStack_1918 = (long)iVar1;
    lStack_1910 = 0;
    if (lStack_1918 != 0) goto LAB_001d8b4f;
    pcStack_1920 = (code *)0x1d896b;
    iVar1 = uv_is_readable(alStack_1908);
    if (iVar1 != 0) goto LAB_001d8b61;
    pcStack_1920 = (code *)0x1d897d;
    iVar1 = uv_is_writable(alStack_1908);
    if (iVar1 == 0) goto LAB_001d8b66;
    plVar6 = alStack_1908;
    pcStack_1920 = (code *)0x1d8994;
    uv_close(plVar6,0);
    pcStack_1920 = (code *)0x1d899c;
    iVar1 = uv_is_readable(plVar6);
    if (iVar1 != 0) goto LAB_001d8b6b;
    pcStack_1920 = (code *)0x1d89ae;
    iVar1 = uv_is_writable(alStack_1908);
    if (iVar1 == 0) goto LAB_001d89b6;
  }
  else {
    pcStack_1920 = (code *)0x1d8a49;
    run_test_tty_file_cold_1();
LAB_001d8a49:
    pcStack_1920 = (code *)0x1d8a56;
    run_test_tty_file_cold_27();
LAB_001d8a56:
    pcStack_1920 = (code *)0x1d8a63;
    run_test_tty_file_cold_28();
LAB_001d8a63:
    pcStack_1920 = (code *)0x1d8a75;
    run_test_tty_file_cold_2();
LAB_001d8a75:
    pcStack_1920 = (code *)0x1d8a87;
    run_test_tty_file_cold_3();
LAB_001d8a87:
    pcStack_1920 = (code *)0x1d8a99;
    run_test_tty_file_cold_5();
LAB_001d8a99:
    pcStack_1920 = (code *)0x1d8aab;
    run_test_tty_file_cold_4();
LAB_001d8aab:
    pcStack_1920 = (code *)0x1d8abd;
    run_test_tty_file_cold_6();
LAB_001d8abd:
    pcStack_1920 = (code *)0x1d8acf;
    run_test_tty_file_cold_7();
LAB_001d8acf:
    pcStack_1920 = (code *)0x1d8ae1;
    run_test_tty_file_cold_8();
LAB_001d8ae1:
    pcStack_1920 = (code *)0x1d8af3;
    run_test_tty_file_cold_9();
LAB_001d8af3:
    pcStack_1920 = (code *)0x1d8b05;
    run_test_tty_file_cold_10();
LAB_001d8b05:
    pcStack_1920 = (code *)0x1d8b0a;
    run_test_tty_file_cold_14();
LAB_001d8b0a:
    pcStack_1920 = (code *)0x1d8b0f;
    run_test_tty_file_cold_13();
LAB_001d8b0f:
    pcStack_1920 = (code *)0x1d8b1c;
    run_test_tty_file_cold_15();
LAB_001d8b1c:
    pcStack_1920 = (code *)0x1d8b21;
    run_test_tty_file_cold_11();
LAB_001d8b21:
    pcStack_1920 = (code *)0x1d8b2e;
    run_test_tty_file_cold_16();
LAB_001d8b2e:
    pcStack_1920 = (code *)0x1d8b33;
    run_test_tty_file_cold_12();
LAB_001d8b33:
    pcStack_1920 = (code *)0x1d8b38;
    run_test_tty_file_cold_20();
LAB_001d8b38:
    pcStack_1920 = (code *)0x1d8b3d;
    run_test_tty_file_cold_17();
LAB_001d8b3d:
    pcStack_1920 = (code *)0x1d8b4a;
    run_test_tty_file_cold_21();
LAB_001d8b4a:
    pcStack_1920 = (code *)0x1d8b4f;
    run_test_tty_file_cold_18();
LAB_001d8b4f:
    pcStack_1920 = (code *)0x1d8b5c;
    run_test_tty_file_cold_22();
LAB_001d8b5c:
    pcStack_1920 = (code *)0x1d8b61;
    run_test_tty_file_cold_19();
LAB_001d8b61:
    pcStack_1920 = (code *)0x1d8b66;
    run_test_tty_file_cold_23();
LAB_001d8b66:
    pcStack_1920 = (code *)0x1d8b6b;
    run_test_tty_file_cold_26();
LAB_001d8b6b:
    pcStack_1920 = (code *)0x1d8b70;
    run_test_tty_file_cold_24();
  }
  pcStack_1920 = run_test_tty_pty;
  run_test_tty_file_cold_25();
  puVar9 = &uStack_1ea0;
  plStack_1928 = plVar6;
  pcStack_1920 = (code *)piVar7;
  iVar1 = uv_loop_init(auStack_1c50);
  alStack_1e80[0] = (long)iVar1;
  auStack_1d68[0] = 0;
  if (alStack_1e80[0] == 0) {
    iVar1 = openpty(&iStack_1e8c,&iStack_1e90,0,0,auStack_1e88);
    if (iVar1 != 0) {
      run_test_tty_pty_cold_2();
      return 7;
    }
    iVar1 = uv_tty_init(auStack_1c50,auStack_1d68,iStack_1e90,0);
    alStack_1e80[0] = (long)iVar1;
    uStack_1ea0 = 0;
    if (alStack_1e80[0] != 0) goto LAB_001d8dd3;
    iVar1 = uv_tty_init(auStack_1c50,alStack_1e80,iStack_1e8c,0);
    uStack_1ea0 = (ulong)iVar1;
    uStack_1e98 = 0;
    if (uStack_1ea0 != 0) goto LAB_001d8de0;
    iVar1 = uv_is_readable(auStack_1d68);
    if (iVar1 == 0) goto LAB_001d8ded;
    iVar1 = uv_is_writable(auStack_1d68);
    if (iVar1 == 0) goto LAB_001d8df2;
    iVar1 = uv_is_readable(alStack_1e80);
    if (iVar1 == 0) goto LAB_001d8df7;
    iVar1 = uv_is_writable(alStack_1e80);
    if (iVar1 == 0) goto LAB_001d8dfc;
    uStack_1ea0 = (ulong)(uStack_1d30 & 0x100000);
    uStack_1e98 = 0;
    if (uStack_1ea0 != 0) goto LAB_001d8e01;
    if ((bStack_1e46 & 0x10) == 0) goto LAB_001d8e0e;
    iVar1 = close(iStack_1e90);
    uStack_1ea0 = (ulong)iVar1;
    uStack_1e98 = 0;
    if (uStack_1ea0 != 0) goto LAB_001d8e13;
    uv_close(auStack_1d68,0);
    iVar1 = close(iStack_1e8c);
    uStack_1ea0 = (ulong)iVar1;
    uStack_1e98 = 0;
    if (uStack_1ea0 != 0) goto LAB_001d8e20;
    uv_close(alStack_1e80,0);
    iVar1 = uv_run(auStack_1c50,0);
    uStack_1ea0 = (ulong)iVar1;
    uStack_1e98 = 0;
    if (uStack_1ea0 == 0) {
      uv_walk(auStack_1c50,close_walk_cb,0);
      uv_run(auStack_1c50,0);
      uStack_1ea0 = 0;
      iVar1 = uv_loop_close(auStack_1c50);
      uStack_1e98 = (ulong)iVar1;
      if (uStack_1ea0 == uStack_1e98) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001d8e3a;
    }
  }
  else {
    run_test_tty_pty_cold_1();
LAB_001d8dd3:
    run_test_tty_pty_cold_3();
LAB_001d8de0:
    run_test_tty_pty_cold_4();
LAB_001d8ded:
    run_test_tty_pty_cold_14();
LAB_001d8df2:
    run_test_tty_pty_cold_13();
LAB_001d8df7:
    run_test_tty_pty_cold_12();
LAB_001d8dfc:
    run_test_tty_pty_cold_11();
LAB_001d8e01:
    run_test_tty_pty_cold_5();
LAB_001d8e0e:
    run_test_tty_pty_cold_10();
LAB_001d8e13:
    run_test_tty_pty_cold_6();
LAB_001d8e20:
    run_test_tty_pty_cold_7();
  }
  run_test_tty_pty_cold_8();
LAB_001d8e3a:
  run_test_tty_pty_cold_9();
  iVar1 = uv_is_closing();
  if (iVar1 == 0) {
    iVar1 = uv_close(puVar9,0);
    return iVar1;
  }
  return iVar1;
}

Assistant:

TEST_IMPL(tmpdir) {
  char tmpdir[PATHMAX];
  size_t len;
  char last;
  int r;

  /* Test the normal case */
  len = sizeof tmpdir;
  tmpdir[0] = '\0';

  ASSERT_OK(strlen(tmpdir));
  r = uv_os_tmpdir(tmpdir, &len);
  ASSERT_OK(r);
  ASSERT_EQ(strlen(tmpdir), len);
  ASSERT_GT(len, 0);
  ASSERT_EQ(tmpdir[len], '\0');

  if (len > 1) {
    last = tmpdir[len - 1];
#ifdef _WIN32
    ASSERT_NE(last, '\\');
#else
    ASSERT_NE(last, '/');
#endif
  }

  /* Test the case where the buffer is too small */
  len = SMALLPATH;
  r = uv_os_tmpdir(tmpdir, &len);
  ASSERT_EQ(r, UV_ENOBUFS);
  ASSERT_GT(len, SMALLPATH);

  /* Test invalid inputs */
  r = uv_os_tmpdir(NULL, &len);
  ASSERT_EQ(r, UV_EINVAL);
  r = uv_os_tmpdir(tmpdir, NULL);
  ASSERT_EQ(r, UV_EINVAL);
  len = 0;
  r = uv_os_tmpdir(tmpdir, &len);
  ASSERT_EQ(r, UV_EINVAL);

#ifdef _WIN32
  const char *name = "TMP";
  char tmpdir_win[] = "C:\\xxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxx";
  r = uv_os_setenv(name, tmpdir_win);
  ASSERT_OK(r);
  char tmpdirx[PATHMAX];
  size_t lenx = sizeof tmpdirx;
  r = uv_os_tmpdir(tmpdirx, &lenx);
  ASSERT_OK(r);
#endif

  return 0;
}